

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs::iterate
          (TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQuerySingleStreamBase).
                      super_TransformFeedbackOverflowQueryFunctionalBase.
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback2
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Required transform_feedback2 extension is not supported",
               &local_39);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(local_18 + 0x30))(0);
  TransformFeedbackOverflowQueryFunctionalBase::drawPoints
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,8);
  (**(code **)(local_18 + 0xfe0))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0');
  TransformFeedbackOverflowQueryFunctionalBase::drawPoints
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,0xb);
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0');
  (**(code **)(local_18 + 0x1248))();
  TransformFeedbackOverflowQueryFunctionalBase::drawPoints
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,1);
  (**(code **)(local_18 + 0xfe0))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0');
  (**(code **)(local_18 + 0x1248))();
  TransformFeedbackOverflowQueryFunctionalBase::drawPoints
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,2);
  (**(code **)(local_18 + 0x638))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\x01');
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQuerySingleStreamBase).
             super_TransformFeedbackOverflowQueryFunctionalBase.
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// If GL 4.0 and ARB_transform_feedback2 are not supported then skip this
		// test case.
		if (!supportsTransformFeedback2())
		{
			throw tcu::NotSupportedError("Required transform_feedback2 extension is not supported");
		}

		// Call BeginTransformFeedback with mode POINTS.
		gl.beginTransformFeedback(GL_POINTS);

		// Start the query, submit draw that results in feeding back exactly 8
		// triangles, then stop the query.
		drawPoints(8);

		// Call PauseTransformFeedback.
		gl.pauseTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// query is FALSE.
		verifyQueryResults(GL_FALSE);

		// Start the query, submit draw that would result in feeding back more than
		// 10 points if transform feedback wasn't paused, then stop the query.
		drawPoints(11);

		// Use the basic checking mechanism to validate that the result of the
		// query is FALSE.
		verifyQueryResults(GL_FALSE);

		// Call ResumeTransformFeedback.
		gl.resumeTransformFeedback();

		// Start the query, submit draw that results in feeding back exactly 1
		// point, then stop the query.
		drawPoints(1);

		// Call PauseTransformFeedback.
		gl.pauseTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// query is FALSE.
		verifyQueryResults(GL_FALSE);

		// Call ResumeTransformFeedback.
		gl.resumeTransformFeedback();

		// Start the query, submit draw that results in feeding back exactly 2
		// point, then stop the query.
		drawPoints(2);

		// Call EndTransformFeedback.
		gl.endTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// query is TRUE.
		verifyQueryResults(GL_TRUE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}